

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomNurbsCurves>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomNurbsCurves *curves,string *warn,string *err,PrimReconstructOptions *options)

{
  optional<tinyusdz::Interpolation> oVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 uVar7;
  uint uVar8;
  int iVar9;
  ostream *poVar10;
  optional<tinyusdz::Interpolation> *poVar11;
  const_iterator cVar12;
  mapped_type *this;
  _Base_ptr p_Var13;
  undefined8 uVar14;
  anon_struct_8_0_00000001_for___align __n;
  bool bVar15;
  byte bVar16;
  undefined1 auVar17 [8];
  ulong uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  Property *pPVar19;
  char cVar20;
  _Rb_tree_header *p_Var21;
  pointer pSVar22;
  long lVar23;
  Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_> dst;
  ParseResult ret;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined4 in_stack_fffffffffffffb0c;
  undefined1 local_4f0 [8];
  char *local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  string local_4c8;
  TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  local_4a8;
  undefined1 local_488 [8];
  undefined1 local_480 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  pointer local_460;
  _Alloc_hider _Stack_458;
  size_type local_450;
  bool abStack_448 [16];
  storage_union local_438;
  byte local_428;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_420;
  undefined1 local_408 [32];
  undefined1 local_3e8 [32];
  GeomNurbsCurves *local_3c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380 [2];
  undefined8 local_360;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_358;
  storage_t<double> local_350;
  string *local_348;
  storage_t<tinyusdz::Token> local_340;
  string *local_320;
  storage_t<tinyusdz::Token> local_318;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [8];
  undefined1 local_2d0 [8];
  undefined1 auStack_2c8 [96];
  ios_base local_268 [16];
  ios_base local_258 [264];
  string local_150 [16];
  undefined8 local_140 [2];
  string local_130 [16];
  undefined1 local_120 [32];
  undefined8 local_100 [2];
  pointer local_f0 [4];
  string local_d0 [16];
  undefined1 local_c0 [32];
  undefined8 local_a0 [2];
  string local_90 [16];
  undefined1 local_80 [32];
  undefined8 local_60 [2];
  pointer *local_50 [2];
  pointer local_40 [2];
  
  local_3c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c0._M_impl.super__Rb_tree_header._M_header;
  local_3c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar15 = false;
  local_3c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar8 = (uint)options->strict_allowedToken_check;
  abStack_448._8_8_ = err;
  local_3c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c0._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_3c0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&curves->super_GPrim,warn,err,options->strict_allowedToken_check)
  ;
  if (bVar6) {
    p_Var13 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var21 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar15 = true;
    if ((_Rb_tree_header *)p_Var13 != p_Var21) {
      local_318._16_8_ = &curves->curveVertexCounts;
      local_318.data._0_8_ = (undefined8)&curves->points;
      local_320 = (string *)&curves->velocities;
      local_340._24_8_ = &curves->normals;
      local_340._16_8_ = &curves->accelerations;
      local_340._8_8_ = &curves->widths;
      local_340.data._0_8_ = (undefined8)&curves->order;
      local_348 = (string *)&curves->knots;
      local_438._8_8_ = &curves->ranges;
      local_358 = &(curves->ranges)._paths;
      local_380[1]._0_8_ = &(curves->ranges)._attrib;
      local_350 = (storage_t<double>)&curves->pointWeights;
      local_380[1]._8_8_ = &(curves->super_GPrim).props;
      local_3c8 = curves;
      local_360 = warn;
      local_318._8_8_ = p_Var21;
      do {
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,*(long *)(p_Var13 + 1),
                   (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1));
        local_318._24_8_ = p_Var13;
        local_2d8 = (undefined1  [8])auStack_2c8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d8,"curveVertexCounts","");
        pPVar19 = (Property *)local_2d8;
        local_438.dynamic = (Property *)(p_Var13 + 2);
        (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                  ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50,(string *)(p_Var13 + 2),(Property *)local_2d8,
                   (string *)local_318._16_8_,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *
                   )CONCAT44(in_stack_fffffffffffffb0c,uVar8));
        if (local_2d8 != (undefined1  [8])auStack_2c8) {
          operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],(ulong)((long)&(local_40[0]->value)._M_dataplus._M_p + 1));
        }
        uVar5 = local_318._24_8_;
        iVar9 = 0;
        if (((ulong)local_488 & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_001f9352:
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if (local_488._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc60);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_4f0 = (undefined1  [8])&local_4e0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[18],std::__cxx11::string>
                      (&local_4c8,(fmt *)local_4f0,(string *)"curveVertexCounts",
                       (char (*) [18])local_480,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar19)
            ;
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                 CONCAT62(local_4c8._M_string_length._2_6_,
                                          (undefined2)local_4c8._M_string_length));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
              operator_delete(local_4c8._M_dataplus._M_p,
                              CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                       local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
            }
            uVar14 = abStack_448._8_8_;
            if (local_4f0 != (undefined1  [8])&local_4e0) {
              operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
            }
            if ((string *)uVar14 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              poVar11 = (optional<tinyusdz::Interpolation> *)
                        ::std::__cxx11::string::_M_append(local_4f0,*(ulong *)uVar14);
              oVar1 = (optional<tinyusdz::Interpolation>)(poVar11 + 2);
              if (*poVar11 == oVar1) {
                local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                local_4c8.field_2._M_allocated_capacity._2_6_ =
                     (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                local_4c8.field_2._8_2_ = SUB82(poVar11[3],0);
                local_4c8.field_2._10_6_ = SUB86(poVar11[3],2);
                local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
              }
              else {
                local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                local_4c8.field_2._M_allocated_capacity._2_6_ =
                     (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                local_4c8._M_dataplus._M_p = (pointer)*poVar11;
              }
              local_4c8._M_string_length._0_2_ = SUB82(poVar11[1],0);
              local_4c8._M_string_length._2_6_ = SUB86(poVar11[1],2);
              *poVar11 = oVar1;
              poVar11[1].has_value_ = false;
              *(undefined3 *)&poVar11[1].field_0x1 = 0;
              poVar11[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
              poVar11[2].has_value_ = false;
              ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
            ::std::ios_base::~ios_base(local_268);
            iVar9 = 1;
            goto LAB_001f9352;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._0_8_ != &local_470) {
          operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
        }
        if (bVar6) {
          local_80._16_8_ = local_60;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_80 + 0x10),*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"points","");
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_80 + 0x10),(string *)local_438.dynamic,(Property *)local_2d8,
                     (string *)local_318.data._0_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if ((undefined8 *)local_80._16_8_ != local_60) {
            operator_delete((void *)local_80._16_8_,(ulong)(local_60[0] + 1));
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001f9658:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc61);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"points",(char (*) [7])local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar14 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((string *)uVar14 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar11 = (optional<tinyusdz::Interpolation> *)
                          ::std::__cxx11::string::_M_append(local_4f0,*(ulong *)uVar14);
                oVar1 = (optional<tinyusdz::Interpolation>)(poVar11 + 2);
                if (*poVar11 == oVar1) {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                  local_4c8.field_2._8_2_ = SUB82(poVar11[3],0);
                  local_4c8.field_2._10_6_ = SUB86(poVar11[3],2);
                  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                }
                else {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                  local_4c8._M_dataplus._M_p = (pointer)*poVar11;
                }
                local_4c8._M_string_length._0_2_ = SUB82(poVar11[1],0);
                local_4c8._M_string_length._2_6_ = SUB86(poVar11[1],2);
                *poVar11 = oVar1;
                poVar11[1].has_value_ = false;
                *(undefined3 *)&poVar11[1].field_0x1 = 0;
                poVar11[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar11[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001f9658;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_90._0_8_ = local_80;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_90,*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"velocities","");
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_90,(string *)local_438.dynamic,(Property *)local_2d8,local_320,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if ((undefined1 *)local_90._0_8_ != local_80) {
            operator_delete((void *)local_90._0_8_,local_80._0_8_ + 1);
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001f995e:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc63);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[11],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"velocities",(char (*) [11])local_480
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar14 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((string *)uVar14 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar11 = (optional<tinyusdz::Interpolation> *)
                          ::std::__cxx11::string::_M_append(local_4f0,*(ulong *)uVar14);
                oVar1 = (optional<tinyusdz::Interpolation>)(poVar11 + 2);
                if (*poVar11 == oVar1) {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                  local_4c8.field_2._8_2_ = SUB82(poVar11[3],0);
                  local_4c8.field_2._10_6_ = SUB86(poVar11[3],2);
                  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                }
                else {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                  local_4c8._M_dataplus._M_p = (pointer)*poVar11;
                }
                local_4c8._M_string_length._0_2_ = SUB82(poVar11[1],0);
                local_4c8._M_string_length._2_6_ = SUB86(poVar11[1],2);
                *poVar11 = oVar1;
                poVar11[1].has_value_ = false;
                *(undefined3 *)&poVar11[1].field_0x1 = 0;
                poVar11[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar11[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001f995e;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_c0._16_8_ = local_a0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_c0 + 0x10),*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"normals","");
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_c0 + 0x10),(string *)local_438.dynamic,(Property *)local_2d8,
                     (string *)local_340._24_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if ((undefined8 *)local_c0._16_8_ != local_a0) {
            operator_delete((void *)local_c0._16_8_,local_a0[0] + 1);
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001f9c64:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc65);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[8],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"normals",(char (*) [8])local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar14 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((string *)uVar14 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar11 = (optional<tinyusdz::Interpolation> *)
                          ::std::__cxx11::string::_M_append(local_4f0,*(ulong *)uVar14);
                oVar1 = (optional<tinyusdz::Interpolation>)(poVar11 + 2);
                if (*poVar11 == oVar1) {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                  local_4c8.field_2._8_2_ = SUB82(poVar11[3],0);
                  local_4c8.field_2._10_6_ = SUB86(poVar11[3],2);
                  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                }
                else {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                  local_4c8._M_dataplus._M_p = (pointer)*poVar11;
                }
                local_4c8._M_string_length._0_2_ = SUB82(poVar11[1],0);
                local_4c8._M_string_length._2_6_ = SUB86(poVar11[1],2);
                *poVar11 = oVar1;
                poVar11[1].has_value_ = false;
                *(undefined3 *)&poVar11[1].field_0x1 = 0;
                poVar11[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar11[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001f9c64;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_d0._0_8_ = local_c0;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_d0,*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"accelerations","");
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d0,(string *)local_438.dynamic,(Property *)local_2d8,
                     (string *)local_340._16_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if ((undefined1 *)local_d0._0_8_ != local_c0) {
            operator_delete((void *)local_d0._0_8_,local_c0._0_8_ + 1);
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001f9f6a:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc67);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"accelerations",
                         (char (*) [14])local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar14 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((string *)uVar14 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar11 = (optional<tinyusdz::Interpolation> *)
                          ::std::__cxx11::string::_M_append(local_4f0,*(ulong *)uVar14);
                oVar1 = (optional<tinyusdz::Interpolation>)(poVar11 + 2);
                if (*poVar11 == oVar1) {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                  local_4c8.field_2._8_2_ = SUB82(poVar11[3],0);
                  local_4c8.field_2._10_6_ = SUB86(poVar11[3],2);
                  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                }
                else {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                  local_4c8._M_dataplus._M_p = (pointer)*poVar11;
                }
                local_4c8._M_string_length._0_2_ = SUB82(poVar11[1],0);
                local_4c8._M_string_length._2_6_ = SUB86(poVar11[1],2);
                *poVar11 = oVar1;
                poVar11[1].has_value_ = false;
                *(undefined3 *)&poVar11[1].field_0x1 = 0;
                poVar11[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar11[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001f9f6a;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_f0[0] = (pointer)(local_f0 + 2);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"widths","");
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f0,(string *)local_438.dynamic,(Property *)local_2d8,
                     (string *)local_340._8_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if (local_f0[0] != (pointer)(local_f0 + 2)) {
            operator_delete(local_f0[0],(long)local_f0[2] + 1);
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001fa270:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc68);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"widths",(char (*) [7])local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar14 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((string *)uVar14 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar11 = (optional<tinyusdz::Interpolation> *)
                          ::std::__cxx11::string::_M_append(local_4f0,*(ulong *)uVar14);
                oVar1 = (optional<tinyusdz::Interpolation>)(poVar11 + 2);
                if (*poVar11 == oVar1) {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                  local_4c8.field_2._8_2_ = SUB82(poVar11[3],0);
                  local_4c8.field_2._10_6_ = SUB86(poVar11[3],2);
                  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                }
                else {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                  local_4c8._M_dataplus._M_p = (pointer)*poVar11;
                }
                local_4c8._M_string_length._0_2_ = SUB82(poVar11[1],0);
                local_4c8._M_string_length._2_6_ = SUB86(poVar11[1],2);
                *poVar11 = oVar1;
                poVar11[1].has_value_ = false;
                *(undefined3 *)&poVar11[1].field_0x1 = 0;
                poVar11[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar11[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001fa270;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_120._16_8_ = local_100;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_120 + 0x10),*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"order","");
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_120 + 0x10),(string *)local_438.dynamic,(Property *)local_2d8,
                     (string *)local_340.data._0_8_,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if ((undefined8 *)local_120._16_8_ != local_100) {
            operator_delete((void *)local_120._16_8_,local_100[0] + 1);
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001fa576:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc6b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[6],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"order",(char (*) [6])local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar14 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((string *)uVar14 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar11 = (optional<tinyusdz::Interpolation> *)
                          ::std::__cxx11::string::_M_append(local_4f0,*(ulong *)uVar14);
                oVar1 = (optional<tinyusdz::Interpolation>)(poVar11 + 2);
                if (*poVar11 == oVar1) {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                  local_4c8.field_2._8_2_ = SUB82(poVar11[3],0);
                  local_4c8.field_2._10_6_ = SUB86(poVar11[3],2);
                  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
                }
                else {
                  local_4c8.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                  local_4c8.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                  local_4c8._M_dataplus._M_p = (pointer)*poVar11;
                }
                local_4c8._M_string_length._0_2_ = SUB82(poVar11[1],0);
                local_4c8._M_string_length._2_6_ = SUB86(poVar11[1],2);
                *poVar11 = oVar1;
                poVar11[1].has_value_ = false;
                *(undefined3 *)&poVar11[1].field_0x1 = 0;
                poVar11[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar11[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001fa576;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_130._0_8_ = local_120;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_130,*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"knots","");
          uVar14 = local_438.dynamic;
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_130,(string *)local_438.dynamic,(Property *)local_2d8,local_348,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if ((undefined1 *)local_130._0_8_ != local_120) {
            operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001fa83b:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc6c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              uVar14 = local_480;
              fmt::format<char[6],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"knots",(char (*) [6])uVar14,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar3 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar3 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_4c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4f0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)uVar3);
                ::std::__cxx11::string::operator=((string *)uVar3,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001fa83b;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_390._0_8_ = local_380;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_390,*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_408._0_8_ = local_408 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"ranges","");
          uVar4 = local_390._8_8_;
          uVar3 = local_408._8_8_;
          local_4e8 = local_4e0._M_local_buf + 8;
          local_4e0._M_allocated_capacity = 0;
          local_4e0._M_local_buf[8] = '\0';
          __n = (anon_struct_8_0_00000001_for___align)local_390._8_8_;
          if ((ulong)local_408._8_8_ < (ulong)local_390._8_8_) {
            __n = (anon_struct_8_0_00000001_for___align)local_408._8_8_;
          }
          if (__n == (anon_struct_8_0_00000001_for___align)0x0) {
            if (local_390._8_8_ == local_408._8_8_) goto LAB_001fa91b;
LAB_001faa95:
            local_4f0._0_4_ = 1;
          }
          else {
            iVar9 = bcmp((void *)local_390._0_8_,(void *)local_408._0_8_,(size_t)__n);
            if ((uVar4 != uVar3) || (iVar9 != 0)) goto LAB_001faa95;
LAB_001fa91b:
            if ((*(uint *)(uVar5 + 0x2ec) & 0xfffffffe) == 2) {
              local_4f0._0_4_ = 7;
              local_488 = (undefined1  [8])(local_480 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_488,
                         "Property `{}` must be Attribute, but declared as Relationship.","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_2d8,(fmt *)local_488,(string *)local_408,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14
                        );
              ::std::__cxx11::string::operator=((string *)&local_4e8,(string *)local_2d8);
              if (local_2d8 != (undefined1  [8])auStack_2c8) {
                operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
              }
              if (local_488 != (undefined1  [8])(local_480 + 8)) {
                operator_delete((void *)local_488,local_480._8_8_ + 1);
              }
            }
            if (*(_Base_ptr *)(uVar5 + 0xd0) != *(_Base_ptr *)(uVar5 + 200)) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_358,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(uVar5 + 200));
              local_4f0 = (undefined1  [8])((ulong)local_4f0 & 0xffffffff00000000);
            }
            Attribute::type_name_abi_cxx11_((string *)local_3e8,(Attribute *)local_438.dynamic);
            tinyusdz::value::
            TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>::
            type_name_abi_cxx11_();
            auVar17 = local_2d8;
            if ((local_2d0 != (undefined1  [8])local_3e8._8_8_) ||
               ((bVar6 = true,
                (optional<tinyusdz::Interpolation>)local_2d0 !=
                (optional<tinyusdz::Interpolation>)0x0 &&
                (iVar9 = bcmp((void *)local_2d8,(void *)local_3e8._0_8_,(size_t)local_2d0),
                iVar9 != 0)))) {
              tinyusdz::value::
              TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
              ::underlying_type_name_abi_cxx11_();
              auVar2 = local_488;
              if (local_480._0_8_ == local_3e8._8_8_) {
                if ((optional<tinyusdz::Interpolation>)local_480._0_8_ ==
                    (optional<tinyusdz::Interpolation>)0x0) {
                  bVar6 = true;
                }
                else {
                  iVar9 = bcmp((void *)local_488,(void *)local_3e8._0_8_,local_480._0_8_);
                  bVar6 = iVar9 == 0;
                }
              }
              else {
                bVar6 = false;
              }
              auVar17 = local_2d8;
              if (auVar2 != (undefined1  [8])(local_480 + 8)) {
                operator_delete((void *)auVar2,local_480._8_8_ + 1);
                auVar17 = local_2d8;
              }
            }
            if (auVar17 != (undefined1  [8])auStack_2c8) {
              operator_delete((void *)auVar17,auStack_2c8._0_8_ + 1);
            }
            if (bVar6) {
              if (*(int *)(uVar5 + 0x2ec) == 1) {
                if (*(_Base_ptr *)(uVar5 + 0xb0) == *(_Base_ptr *)(uVar5 + 0xa8)) {
                  if (*(_Base_ptr *)(uVar5 + 0x98) == (_Base_ptr)0x0) {
                    bVar6 = false;
                  }
                  else {
                    iVar9 = (**(code **)*(_Base_ptr *)(uVar5 + 0x98))();
                    bVar6 = iVar9 == 4;
                  }
                  uVar7 = (undefined1)((_Base_ptr)(uVar5 + 0xa0))->_M_color;
                  if ((bVar6) || ((uVar7 & _S_black) != _S_red)) {
                    (local_3c8->ranges)._blocked = true;
                  }
                }
                else {
                  uVar7 = (undefined1)((_Base_ptr)(uVar5 + 0xa0))->_M_color;
                }
                if (((((uVar7 & _S_black) == _S_red) &&
                     (*(_Base_ptr *)(uVar5 + 0x98) != (_Base_ptr)0x0)) &&
                    ((iVar9 = (**(code **)*(_Base_ptr *)(uVar5 + 0x98))(), iVar9 == 0 ||
                     ((*(_Base_ptr *)(uVar5 + 0x98) != (_Base_ptr)0x0 &&
                      (iVar9 = (**(code **)*(_Base_ptr *)(uVar5 + 0x98))(), iVar9 == 1)))))) &&
                   (*(_Base_ptr *)(uVar5 + 0xb0) == *(_Base_ptr *)(uVar5 + 0xa8))) {
                  if (*(_Base_ptr *)(uVar5 + 0xd0) == *(_Base_ptr *)(uVar5 + 200))
                  goto LAB_001fb132;
                  AttrMetas::operator=((AttrMetas *)local_438._8_8_,(AttrMetas *)(uVar5 + 0xe0));
                  __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_390;
                  goto LAB_001fb125;
                }
                local_4a8._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                local_4a8._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                local_4a8._dirty = false;
                local_4a8._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_4a8._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                local_4a8._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                local_4c8.field_2._M_allocated_capacity._0_2_ = 0;
                local_4c8.field_2._M_allocated_capacity._2_6_ = 0;
                local_4c8.field_2._8_2_ = 0;
                local_4c8._M_dataplus._M_p = (pointer)0x0;
                local_4c8._M_string_length._0_2_ = 0;
                local_4c8._M_string_length._2_6_ = 0;
                bVar6 = primvar::PrimVar::is_valid((PrimVar *)(uVar5 + 0x88));
                if (bVar6) {
                  if ((((char)((_Base_ptr)(uVar5 + 0xa0))->_M_color == _S_red) &&
                      (*(_Base_ptr *)(uVar5 + 0x98) != (_Base_ptr)0x0)) &&
                     ((iVar9 = (**(code **)*(_Base_ptr *)(uVar5 + 0x98))(), iVar9 == 0 ||
                      ((*(_Base_ptr *)(uVar5 + 0x98) != (_Base_ptr)0x0 &&
                       (iVar9 = (**(code **)*(_Base_ptr *)(uVar5 + 0x98))(), iVar9 == 1)))))) {
                    bVar16 = 0;
                  }
                  else {
                    primvar::PrimVar::
                    get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                              ((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                *)local_2f8,(PrimVar *)(uVar5 + 0x88));
                    bVar16 = local_2f8[0];
                    local_428 = local_2f8[0];
                    if (local_2f8[0] != false) {
                      local_420.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8._8_8_;
                      local_420.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2f8._16_8_;
                      local_420.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2f8._24_8_
                      ;
                      ::std::
                      vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                      operator=((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 *)&local_4c8,&local_420);
                      local_4c8.field_2._8_2_ = 1;
                    }
                    if (((local_428 & 1) != 0) &&
                       ((anon_struct_8_0_00000001_for___align)
                        local_420.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (anon_struct_8_0_00000001_for___align)0x0)) {
                      operator_delete(local_420.
                                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_420.
                                            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_420.
                                            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  pSVar22 = *(pointer *)(uVar5 + 0xa8);
                  if (*(pointer *)(uVar5 + 0xb0) == pSVar22) {
                    if (bVar16 == 0) goto LAB_001fada2;
                  }
                  else {
                    lVar23 = 0;
                    uVar18 = 0;
                    do {
                      if ((char)((_Base_ptr)(uVar5 + 0xc0))->_M_color == _S_black) {
                        tinyusdz::value::TimeSamples::update((TimeSamples *)(uVar5 + 0xa8));
                        pSVar22 = (((TimeSamples *)(uVar5 + 0xa8))->_samples).
                                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      }
                      if ((&pSVar22->blocked)[lVar23] == true) {
                        TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                        ::add_blocked_sample(&local_4a8,*(double *)((long)&pSVar22->t + lVar23));
                      }
                      else {
                        tinyusdz::value::Value::
                        get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                                  ((optional<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                    *)local_2f8,
                                   (Value *)((long)&(pSVar22->value).v_.storage + lVar23),false);
                        bVar6 = local_2f8[0];
                        local_428 = local_2f8[0];
                        if (local_2f8[0] == true) {
                          local_420.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2f8._8_8_;
                          local_420.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2f8._16_8_;
                          local_420.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)local_2f8._24_8_;
                          TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                          ::add_sample(&local_4a8,*(double *)((long)&pSVar22->t + lVar23),&local_420
                                      );
                        }
                        else {
                          local_450 = 0;
                          abStack_448[0] = false;
                          abStack_448[1] = false;
                          abStack_448[2] = false;
                          abStack_448[3] = false;
                          abStack_448[4] = false;
                          abStack_448[5] = false;
                          abStack_448[6] = false;
                          abStack_448[7] = false;
                          local_460 = (pointer)0x0;
                          _Stack_458._M_p = (pointer)0x0;
                          local_470._M_allocated_capacity = 0;
                          local_470._8_8_ = 0;
                          local_480[0] = false;
                          local_480._1_3_ = 0;
                          local_480._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                          local_480._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                        }
                        if (((local_428 & 1) != 0) &&
                           ((anon_struct_8_0_00000001_for___align)
                            local_420.
                            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (anon_struct_8_0_00000001_for___align)0x0)) {
                          operator_delete(local_420.
                                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_420.
                                                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_420.
                                                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (bVar6 == false) goto LAB_001fadb1;
                      }
                      uVar18 = uVar18 + 1;
                      pSVar22 = *(pointer *)(uVar5 + 0xa8);
                      lVar23 = lVar23 + 0x28;
                    } while (uVar18 < (ulong)(((long)*(_Base_ptr *)(uVar5 + 0xb0) - (long)pSVar22 >>
                                              3) * -0x3333333333333333));
                  }
                  local_488[0] = 1;
                  local_480._10_6_ = local_4c8._M_string_length._2_6_;
                  local_480._8_2_ = (undefined2)local_4c8._M_string_length;
                  local_480._0_8_ = local_4c8._M_dataplus._M_p;
                  local_470._M_allocated_capacity =
                       CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                local_4c8.field_2._M_allocated_capacity._0_2_);
                  local_4c8._M_dataplus._M_p = (pointer)0x0;
                  local_4c8._M_string_length._0_2_ = 0;
                  local_4c8._M_string_length._2_6_ = 0;
                  local_4c8.field_2._M_allocated_capacity._0_2_ = 0;
                  local_4c8.field_2._M_allocated_capacity._2_6_ = 0;
                  local_470._8_2_ = local_4c8.field_2._8_2_;
                  _Stack_458._M_p =
                       (pointer)CONCAT71(local_4a8._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                         local_4a8._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
                  local_460 = local_4a8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_450 = CONCAT71(local_4a8._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                       local_4a8._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
                  local_4a8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                  local_4a8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                  local_4a8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_4a8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                  local_4a8._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                  abStack_448[0] = local_4a8._dirty;
                  cVar20 = '\x01';
                }
                else {
LAB_001fada2:
                  local_450 = 0;
                  abStack_448[0] = false;
                  abStack_448[1] = false;
                  abStack_448[2] = false;
                  abStack_448[3] = false;
                  abStack_448[4] = false;
                  abStack_448[5] = false;
                  abStack_448[6] = false;
                  abStack_448[7] = false;
                  local_460 = (pointer)0x0;
                  _Stack_458._M_p = (pointer)0x0;
                  local_470._M_allocated_capacity = 0;
                  local_470._8_8_ = 0;
                  local_480[0] = false;
                  local_480._1_3_ = 0;
                  local_480._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                  local_480._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
LAB_001fadb1:
                  local_488 = (undefined1  [8])((ulong)local_488 & 0xffffffffffffff00);
                  cVar20 = '\0';
                }
                ::std::
                vector<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::Sample>_>
                ::~vector(&local_4a8._samples);
                if ((optional<tinyusdz::Interpolation>)local_4c8._M_dataplus._M_p !=
                    (optional<tinyusdz::Interpolation>)0x0) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) -
                                  (long)local_4c8._M_dataplus._M_p);
                }
                local_2d8[0] = cVar20;
                if (cVar20 == '\0') {
                  local_4f0._0_4_ = 8;
                  pPVar19 = (Property *)0x55;
                  ::std::__cxx11::string::_M_replace
                            ((ulong)&local_4e8,0,(char *)local_4e0._M_allocated_capacity,0x3a1ff6);
                }
                else {
                  local_2d0 = (undefined1  [8])local_480._0_8_;
                  auStack_2c8._0_8_ = local_480._8_8_;
                  auStack_2c8._8_8_ = local_470._M_allocated_capacity;
                  local_470._M_allocated_capacity = 0;
                  local_480[0] = false;
                  local_480._1_3_ = 0;
                  local_480._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                  local_480._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                  auStack_2c8._16_2_ = local_470._8_2_;
                  auStack_2c8._24_8_ = local_460;
                  auStack_2c8._32_8_ = _Stack_458._M_p;
                  auStack_2c8._40_8_ = local_450;
                  local_450 = 0;
                  local_460 = (pointer)0x0;
                  _Stack_458._M_p = (pointer)0x0;
                  auStack_2c8[0x30] = abStack_448[0];
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                    *)local_480);
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
                  ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
                               *)local_380[1]._0_8_,
                              (Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                               *)local_2d0);
                }
                if (local_2d8[0] == '\x01') {
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                                    *)local_2d0);
                }
                if (cVar20 != '\0') goto LAB_001fb106;
              }
              else if (*(int *)(uVar5 + 0x2ec) == 0) {
                (local_3c8->ranges)._value_empty = true;
LAB_001fb106:
                AttrMetas::operator=((AttrMetas *)local_438._8_8_,(AttrMetas *)(uVar5 + 0xe0));
                __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408
                ;
LAB_001fb125:
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_3c0,__v);
                local_4f0 = (undefined1  [8])((ulong)local_4f0 & 0xffffffff00000000);
              }
              else {
                pPVar19 = (Property *)0x25;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_4e8,0,(char *)local_4e0._M_allocated_capacity,0x3a1d28);
                local_4f0._0_4_ = 8;
              }
            }
            else {
              local_4f0._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_2c8,"Property type mismatch. ",0x18);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)auStack_2c8,(char *)local_408._0_8_,local_408._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," expects type `",0xf);
              tinyusdz::value::
              TypeTraits<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
              ::type_name_abi_cxx11_();
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_488,local_480._0_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"` but defined as type `",0x17);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_3e8._0_8_,local_3e8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"`",1);
              if (local_488 != (undefined1  [8])(local_480 + 8)) {
                operator_delete((void *)local_488,local_480._8_8_ + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_4e8,(string *)local_488);
              if (local_488 != (undefined1  [8])(local_480 + 8)) {
                operator_delete((void *)local_488,local_480._8_8_ + 1);
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_258);
            }
LAB_001fb132:
            if ((pointer)local_3e8._0_8_ != (pointer)(local_3e8 + 0x10)) {
              operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
            }
          }
          if ((pointer)local_408._0_8_ != (pointer)(local_408 + 0x10)) {
            operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._0_8_ != local_380) {
            operator_delete((void *)local_390._0_8_,local_380[0]._M_allocated_capacity + 1);
          }
          iVar9 = 0;
          if (((ulong)local_4f0 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001fb395:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_4f0._0_4_ != 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc6d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4c8,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        ((string *)local_488,(fmt *)&local_4c8,(string *)"ranges",
                         (char (*) [7])&local_4e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,(char *)local_488,local_480._0_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if (local_488 != (undefined1  [8])(local_480 + 8)) {
                operator_delete((void *)local_488,local_480._8_8_ + 1);
              }
              uVar14 = abStack_448._8_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_488,&local_4c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)uVar14);
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)local_488);
                if (local_488 != (undefined1  [8])(local_480 + 8)) {
                  operator_delete((void *)local_488,local_480._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001fb395;
            }
          }
          if (local_4e8 != local_4e0._M_local_buf + 8) {
            operator_delete(local_4e8,CONCAT71(local_4e0._9_7_,local_4e0._M_local_buf[8]) + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          local_150._0_8_ = local_140;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_150,*(long *)(uVar5 + 0x20),
                     (long)&(*(_Base_ptr *)(uVar5 + 0x28))->_M_color + *(long *)(uVar5 + 0x20));
          local_2d8 = (undefined1  [8])auStack_2c8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"pointWeights","");
          pPVar19 = (Property *)local_2d8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<double,std::allocator<double>>>
                    ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_3c0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_150,(string *)local_438.dynamic,(Property *)local_2d8,
                     (string *)local_350,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb0c,uVar8));
          if (local_2d8 != (undefined1  [8])auStack_2c8) {
            operator_delete((void *)local_2d8,auStack_2c8._0_8_ + 1);
          }
          if ((undefined8 *)local_150._0_8_ != local_140) {
            operator_delete((void *)local_150._0_8_,local_140[0] + 1);
          }
          iVar9 = 0;
          if (((ulong)local_488 & 0xfffffffd) == 0) {
            iVar9 = 3;
LAB_001fb654:
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (local_488._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2d8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc6e);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_4f0 = (undefined1  [8])&local_4e0;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        (&local_4c8,(fmt *)local_4f0,(string *)"pointWeights",
                         (char (*) [13])local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar19);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2d8,local_4c8._M_dataplus._M_p,
                                   CONCAT62(local_4c8._M_string_length._2_6_,
                                            (undefined2)local_4c8._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar14 = abStack_448._8_8_;
              if (local_4f0 != (undefined1  [8])&local_4e0) {
                operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_4c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_4f0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)uVar14);
                ::std::__cxx11::string::operator=((string *)uVar14,(string *)&local_4c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                  operator_delete(local_4c8._M_dataplus._M_p,
                                  CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                           local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_4f0 != (undefined1  [8])&local_4e0) {
                  operator_delete((void *)local_4f0,(ulong)(local_4e0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
              ::std::ios_base::~ios_base(local_268);
              iVar9 = 1;
              goto LAB_001fb654;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._0_8_ != &local_470) {
            operator_delete((void *)local_480._0_8_,local_470._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_001fb86d;
          p_Var13 = (_Base_ptr)(uVar5 + 0x20);
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_3c0,(key_type *)p_Var13);
          p_Var21 = &local_3c0._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar12._M_node == p_Var21) {
            this = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                 *)local_380[1]._8_8_,(key_type *)p_Var13);
            Property::operator=(this,(Property *)local_438.dynamic);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var13)
            ;
          }
          cVar12 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&local_3c0,(key_type *)p_Var13);
          if ((_Rb_tree_header *)cVar12._M_node == p_Var21) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2d8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2d8,0xc72);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_488,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var13);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2d8,(char *)local_488,local_480._0_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if (local_488 != (undefined1  [8])(local_480 + 8)) {
              operator_delete((void *)local_488,local_480._8_8_ + 1);
            }
            uVar14 = local_360;
            if ((string *)local_360 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_488,&local_4c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               abStack_448._8_8_);
              ::std::__cxx11::string::operator=((string *)uVar14,(string *)local_488);
              if (local_488 != (undefined1  [8])(local_480 + 8)) {
                operator_delete((void *)local_488,local_480._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                CONCAT62(local_4c8.field_2._M_allocated_capacity._2_6_,
                                         local_4c8.field_2._M_allocated_capacity._0_2_) + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
            ::std::ios_base::~ios_base(local_268);
          }
        }
        else {
LAB_001fb86d:
          if ((iVar9 != 3) && (iVar9 != 0)) {
            bVar15 = false;
            goto LAB_001fb8f8;
          }
        }
        p_Var13 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)uVar5);
      } while (p_Var13 != (_Base_ptr)local_318._8_8_);
      bVar15 = true;
    }
  }
LAB_001fb8f8:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_3c0,(_Link_type)local_3c0._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar15;
}

Assistant:

bool ReconstructPrim(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomNurbsCurves *curves,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, curves, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "curveVertexCounts", GeomNurbsCurves,
                         curves->curveVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomNurbsCurves, curves->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomNurbsCurves,
                          curves->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomNurbsCurves,
                  curves->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomNurbsCurves,
                 curves->accelerations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomNurbsCurves, curves->widths)

    //
    PARSE_TYPED_ATTRIBUTE(table, prop, "order", GeomNurbsCurves, curves->order)
    PARSE_TYPED_ATTRIBUTE(table, prop, "knots", GeomNurbsCurves, curves->knots)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ranges", GeomNurbsCurves, curves->ranges)
    PARSE_TYPED_ATTRIBUTE(table, prop, "pointWeights", GeomNurbsCurves, curves->pointWeights)

    ADD_PROPERTY(table, prop, GeomBasisCurves, curves->props)

    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}